

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void callTM(lua_State *L,TValue *f,TValue *p1,TValue *p2,TValue *p3,int hasres)

{
  StkId pTVar1;
  StkId pTVar2;
  long lVar3;
  
  lVar3 = (long)p3 - (long)L->stack;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->value_ = f->value_;
  pTVar1->tt_ = f->tt_;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->value_ = p1->value_;
  pTVar1->tt_ = p1->tt_;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->value_ = p2->value_;
  pTVar1->tt_ = p2->tt_;
  if (hasres == 0) {
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->value_ = p3->value_;
    pTVar1->tt_ = p3->tt_;
  }
  luaD_call(L,(StkId)((long)L->top - (ulong)(uint)((4 - hasres) * 0x10)),hasres,
            L->ci->callstatus & 1);
  if (hasres != 0) {
    pTVar1 = L->top;
    pTVar2 = L->stack;
    L->top = pTVar1 + -1;
    *(Value *)((long)pTVar2 + lVar3) = pTVar1[-1].value_;
    *(int *)((long)pTVar2 + lVar3 + 8) = pTVar1[-1].tt_;
  }
  return;
}

Assistant:

static void callTM (lua_State *L, const TValue *f, const TValue *p1,
                    const TValue *p2, TValue *p3, int hasres) {
  ptrdiff_t result = savestack(L, p3);
  setobj2s(L, L->top++, f);  /* push function */
  setobj2s(L, L->top++, p1);  /* 1st argument */
  setobj2s(L, L->top++, p2);  /* 2nd argument */
  if (!hasres)  /* no result? 'p3' is third argument */
    setobj2s(L, L->top++, p3);  /* 3rd argument */
  /* metamethod may yield only when called from Lua code */
  luaD_call(L, L->top - (4 - hasres), hasres, isLua(L->ci));
  if (hasres) {  /* if has result, move it to its place */
    p3 = restorestack(L, result);
    setobjs2s(L, p3, --L->top);
  }
}